

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel.cpp
# Opt level: O1

QDebug operator<<(QDebug dbg,QPersistentModelIndex *idx)

{
  Stream *pSVar1;
  QPersistentModelIndexData *pQVar2;
  long *in_RDX;
  QDebug *this;
  long in_FS_OFFSET;
  undefined1 local_40 [24];
  QDebug local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar1 = (Stream *)idx->d;
  if (*in_RDX == 0) {
    pSVar1->ref = pSVar1->ref + 1;
    local_40._0_8_ = pSVar1;
    operator<<((Stream *)(local_40 + 8),(QModelIndex *)local_40);
    QDebug::~QDebug((QDebug *)(local_40 + 8));
    this = (QDebug *)local_40;
  }
  else {
    pSVar1->ref = pSVar1->ref + 1;
    local_40._16_8_ = pSVar1;
    operator<<((Stream *)&local_28,(QModelIndex *)(local_40 + 0x10));
    QDebug::~QDebug(&local_28);
    this = (QDebug *)(local_40 + 0x10);
  }
  QDebug::~QDebug(this);
  pQVar2 = idx->d;
  idx->d = (QPersistentModelIndexData *)0x0;
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QPersistentModelIndex &idx)
{
    if (idx.d)
        dbg << idx.d->index;
    else
        dbg << QModelIndex();
    return dbg;
}